

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quest.c
# Opt level: O1

int simplify_comp_quest(comp_quest_t *q,uint32 n_phone)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  
  if (q->sum_len == 0) {
    iVar2 = 0;
  }
  else {
    uVar3 = 0;
    iVar2 = 0;
    do {
      uVar1 = simplify_conj(q->conj_q[uVar3],q->prod_len[uVar3],n_phone);
      if (uVar1 < q->prod_len[uVar3]) {
        q->prod_len[uVar3] = uVar1;
        iVar2 = 1;
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 < q->sum_len);
  }
  return iVar2;
}

Assistant:

int
simplify_comp_quest(comp_quest_t *q,
		    uint32 n_phone)
{
    int i;
    int ret = FALSE;
    int prod_len;

    for (i = 0; i < q->sum_len; i++) {
	prod_len = simplify_conj(q->conj_q[i], q->prod_len[i], n_phone);
	if (prod_len < q->prod_len[i]) {
	    assert(!(prod_len > q->prod_len[i]));
	    
	    q->prod_len[i] = prod_len;

	    ret = TRUE;
	}
    }

    /* TRUE if there is at least one term in the composite
     * question that was simplified */
    return ret;
}